

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

uint32_t lys_module_pos(lys_module *module)

{
  uint uVar1;
  LY_ERR *pLVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (module->ctx->models).used;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  while( true ) {
    if (uVar3 == uVar4) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
             ,0xf73);
      return 0;
    }
    if ((module->ctx->models).list[uVar4] == module) break;
    uVar4 = uVar4 + 1;
  }
  return (int)uVar4 + 1;
}

Assistant:

static uint32_t
lys_module_pos(struct lys_module *module)
{
    int i;
    uint32_t pos = 1;

    for (i = 0; i < module->ctx->models.used; ++i) {
        if (module->ctx->models.list[i] == module) {
            return pos;
        }
        ++pos;
    }

    LOGINT;
    return 0;
}